

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEFilter<unsigned_short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  unsafe_unique_array<bool> *this;
  bool bVar1;
  undefined2 uVar2;
  uint uVar3;
  idx_t iVar4;
  RLEScanState<unsigned_short> *this_00;
  data_ptr_t pdVar5;
  pointer __p_00;
  InternalException *this_01;
  idx_t iVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  rle_count_t *index_pointer;
  data_ptr_t dataptr;
  ulong uVar12;
  idx_t iVar13;
  pointer __p;
  SelectionVector run_matches;
  SelectionVector matching_sel;
  LogicalType local_b0;
  Vector run_vector;
  
  this_00 = (RLEScanState<unsigned_short> *)
            unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  pdVar5 = BufferHandle::Ptr(&this_00->handle);
  iVar13 = segment->offset;
  dataptr = pdVar5 + iVar13 + 8;
  uVar3 = this_00->rle_count_offset;
  if ((this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl == (bool *)0x0) {
    uVar11 = (ulong)uVar3 - 8 >> 1;
    this = &this_00->matching_runs;
    __p_00 = (pointer)operator_new__(uVar11);
    switchD_004a0b15::default(__p_00,0,uVar11);
    run_vector.vector_type = FLAT_VECTOR;
    run_vector._1_7_ = 0;
    ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
              ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)this,__p_00);
    ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
              ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&run_vector);
    switchD_004a0b15::default
              ((this->super_unique_ptr<bool[],_std::default_delete<bool[]>_>)._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,uVar11);
    LogicalType::LogicalType(&local_b0,&result->type);
    Vector::Vector(&run_vector,&local_b0,dataptr);
    LogicalType::~LogicalType(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&matching_sel);
    Vector::ToUnifiedFormat(&run_vector,uVar11,(UnifiedVectorFormat *)&matching_sel);
    run_matches.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    run_matches.sel_vector = (sel_t *)0x0;
    run_matches.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00->matching_run_count = uVar11;
    ColumnSegment::FilterSelection
              (&run_matches,&run_vector,(UnifiedVectorFormat *)&matching_sel,filter,filter_state,
               uVar11,&this_00->matching_run_count);
    iVar4 = this_00->matching_run_count;
    for (iVar6 = 0; iVar4 != iVar6; iVar6 = iVar6 + 1) {
      iVar7 = iVar6;
      if (run_matches.sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)run_matches.sel_vector[iVar6];
      }
      (this->super_unique_ptr<bool[],_std::default_delete<bool[]>_>)._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar7] = true;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&run_matches.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&matching_sel);
    Vector::~Vector(&run_vector);
  }
  if (this_00->matching_run_count == 0) {
    *sel_count = 0;
  }
  else {
    index_pointer = (rle_count_t *)(pdVar5 + uVar3 + iVar13);
    pdVar5 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector(&matching_sel,*sel_count);
    if (sel->sel_vector == (sel_t *)0x0) {
      uVar11 = *sel_count;
      uVar12 = 0;
      iVar13 = 0;
LAB_004bc55d:
      uVar8 = uVar11 - uVar12;
      if (uVar12 <= uVar11 && uVar8 != 0) {
        iVar4 = this_00->entry_pos;
        iVar6 = this_00->position_in_entry;
        uVar9 = index_pointer[iVar4] - iVar6;
        uVar2 = *(undefined2 *)(dataptr + iVar4 * 2);
        bVar1 = (this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t
                .super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar4];
        if (uVar9 <= uVar8) goto code_r0x004bc58d;
        if (bVar1 != false) {
          for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined2 *)(pdVar5 + uVar12 * 2) = uVar2;
            matching_sel.sel_vector[iVar13] = (sel_t)uVar12;
            iVar13 = iVar13 + 1;
          }
        }
        this_00->position_in_entry = iVar6 + uVar8;
      }
      goto LAB_004bc51c;
    }
    iVar13 = 0;
    uVar11 = 0;
    for (uVar12 = 0; uVar12 < *sel_count; uVar12 = uVar12 + 1) {
      uVar8 = uVar12;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar12];
      }
      if (uVar8 < uVar11) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&run_vector,
                   "Error in RLEFilter - selection vector indices are not ordered",
                   (allocator *)&run_matches);
        InternalException::InternalException(this_01,(string *)&run_vector);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      RLEScanState<unsigned_short>::SkipInternal(this_00,index_pointer,uVar8 - uVar11);
      if ((this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[this_00->entry_pos] == true) {
        *(undefined2 *)(pdVar5 + uVar8 * 2) = *(undefined2 *)(dataptr + this_00->entry_pos * 2);
        matching_sel.sel_vector[iVar13] = (sel_t)uVar8;
        iVar13 = iVar13 + 1;
      }
      uVar11 = uVar8;
    }
    RLEScanState<unsigned_short>::SkipInternal(this_00,index_pointer,vector_count - uVar11);
LAB_004bc51c:
    if (iVar13 != *sel_count) {
      SelectionVector::Initialize(sel,&matching_sel);
      *sel_count = iVar13;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&matching_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
code_r0x004bc58d:
  uVar8 = uVar12;
  uVar10 = uVar9;
  if (bVar1 != false) {
    while (uVar10 != 0) {
      *(undefined2 *)(pdVar5 + uVar8 * 2) = uVar2;
      matching_sel.sel_vector[iVar13] = (sel_t)uVar8;
      iVar13 = iVar13 + 1;
      uVar8 = uVar8 + 1;
      uVar10 = uVar10 - 1;
    }
  }
  uVar12 = uVar12 + uVar9;
  this_00->entry_pos = iVar4 + 1;
  this_00->position_in_entry = 0;
  goto LAB_004bc55d;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}